

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

Rgba * __thiscall ImagePalette::registerColor(ImagePalette *this,Rgba *rgba)

{
  bool bVar1;
  uint16_t uVar2;
  Rgba *lhs;
  
  uVar2 = Rgba::cgbColor(rgba);
  lhs = (Rgba *)((this->_colors)._M_elems + uVar2);
  uVar2 = Rgba::cgbColor(rgba);
  if (uVar2 == 0x8000) {
    options.hasTransparentPixels = true;
  }
  if (lhs[1].red == '\0') {
    *lhs = *rgba;
    lhs[1].red = '\x01';
  }
  else {
    bVar1 = operator!=(lhs,rgba);
    if (bVar1) {
      uVar2 = Rgba::cgbColor(lhs);
      if (uVar2 != 0xffff) {
        return lhs;
      }
      __assert_fail("slot->cgbColor() != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x38,"registerColor");
    }
  }
  return (Rgba *)0x0;
}

Assistant:

[[nodiscard]] Rgba const *registerColor(Rgba const &rgba) {
		decltype(_colors)::value_type &slot = _colors[rgba.cgbColor()];

		if (rgba.cgbColor() == Rgba::transparent) {
			options.hasTransparentPixels = true;
		}

		if (!slot.has_value()) {
			slot.emplace(rgba);
		} else if (*slot != rgba) {
			assert(slot->cgbColor() != UINT16_MAX);
			return &*slot;
		}
		return nullptr;
	}